

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O1

void __thiscall leveldb::FindFileTest_Single_Test::TestBody(FindFileTest_Single_Test *this)

{
  char cVar1;
  size_type sVar2;
  bool bVar3;
  pointer *__ptr;
  char *pcVar4;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertionResult local_68;
  AssertHelper local_58;
  AssertHelper local_50;
  string local_48;
  
  FindFileTest::Add(&this->super_FindFileTest,"p","q",100,100);
  local_68.success_ = false;
  local_68._1_3_ = 0;
  local_58.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"a");
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_48,"0","Find(\"a\")",(int *)&local_68,(int *)&local_58);
  cVar1 = (char)local_48._M_dataplus._M_p;
  if ((char)local_48._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_68);
    if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_48._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
               ,0x40,pcVar4);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)CONCAT44(local_68._4_4_,local_68._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68._4_4_,local_68._0_4_) + 8))();
    }
  }
  sVar2 = local_48._M_string_length;
  if ((undefined8 *)local_48._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_48._M_string_length !=
        (undefined8 *)(local_48._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_48._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  if (cVar1 != '\0') {
    local_68.success_ = false;
    local_68._1_3_ = 0;
    local_58.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"p");
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_48,"0","Find(\"p\")",(int *)&local_68,(int *)&local_58);
    cVar1 = (char)local_48._M_dataplus._M_p;
    if ((char)local_48._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_68);
      if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)local_48._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                 ,0x41,pcVar4);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if ((long *)CONCAT44(local_68._4_4_,local_68._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_68._4_4_,local_68._0_4_) + 8))();
      }
    }
    sVar2 = local_48._M_string_length;
    if ((undefined8 *)local_48._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_48._M_string_length !=
          (undefined8 *)(local_48._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_48._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
    if (cVar1 != '\0') {
      local_68.success_ = false;
      local_68._1_3_ = 0;
      local_58.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"p1");
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_48,"0","Find(\"p1\")",(int *)&local_68,(int *)&local_58);
      cVar1 = (char)local_48._M_dataplus._M_p;
      if ((char)local_48._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_68);
        if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)local_48._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                   ,0x42,pcVar4);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if ((long *)CONCAT44(local_68._4_4_,local_68._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_68._4_4_,local_68._0_4_) + 8))();
        }
      }
      sVar2 = local_48._M_string_length;
      if ((undefined8 *)local_48._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_48._M_string_length !=
            (undefined8 *)(local_48._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_48._M_string_length);
        }
        operator_delete((void *)sVar2);
      }
      if (cVar1 != '\0') {
        local_68.success_ = false;
        local_68._1_3_ = 0;
        local_58.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"q");
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_48,"0","Find(\"q\")",(int *)&local_68,(int *)&local_58);
        cVar1 = (char)local_48._M_dataplus._M_p;
        if ((char)local_48._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_68);
          if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)local_48._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                     ,0x43,pcVar4);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          if ((long *)CONCAT44(local_68._4_4_,local_68._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_68._4_4_,local_68._0_4_) + 8))();
          }
        }
        sVar2 = local_48._M_string_length;
        if ((undefined8 *)local_48._M_string_length != (undefined8 *)0x0) {
          if (*(undefined8 **)local_48._M_string_length !=
              (undefined8 *)(local_48._M_string_length + 0x10)) {
            operator_delete(*(undefined8 **)local_48._M_string_length);
          }
          operator_delete((void *)sVar2);
        }
        if (cVar1 != '\0') {
          local_68.success_ = true;
          local_68._1_3_ = 0;
          local_58.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"q1");
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&local_48,"1","Find(\"q1\")",(int *)&local_68,(int *)&local_58);
          cVar1 = (char)local_48._M_dataplus._M_p;
          if ((char)local_48._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_68);
            if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)local_48._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_58,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                       ,0x44,pcVar4);
            testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
            testing::internal::AssertHelper::~AssertHelper(&local_58);
            if ((long *)CONCAT44(local_68._4_4_,local_68._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_68._4_4_,local_68._0_4_) + 8))();
            }
          }
          sVar2 = local_48._M_string_length;
          if ((undefined8 *)local_48._M_string_length != (undefined8 *)0x0) {
            if (*(undefined8 **)local_48._M_string_length !=
                (undefined8 *)(local_48._M_string_length + 0x10)) {
              operator_delete(*(undefined8 **)local_48._M_string_length);
            }
            operator_delete((void *)sVar2);
          }
          if (cVar1 != '\0') {
            local_68.success_ = true;
            local_68._1_3_ = 0;
            local_58.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"z");
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&local_48,"1","Find(\"z\")",(int *)&local_68,(int *)&local_58);
            cVar1 = (char)local_48._M_dataplus._M_p;
            if ((char)local_48._M_dataplus._M_p == '\0') {
              testing::Message::Message((Message *)&local_68);
              if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = *(char **)local_48._M_string_length;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_58,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                         ,0x45,pcVar4);
              testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
              testing::internal::AssertHelper::~AssertHelper(&local_58);
              if ((long *)CONCAT44(local_68._4_4_,local_68._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_68._4_4_,local_68._0_4_) + 8))();
              }
            }
            if ((undefined8 *)local_48._M_string_length != (undefined8 *)0x0) {
              if (*(undefined8 **)local_48._M_string_length !=
                  (undefined8 *)(local_48._M_string_length + 0x10)) {
                operator_delete(*(undefined8 **)local_48._M_string_length);
              }
              operator_delete((void *)local_48._M_string_length);
            }
            if (cVar1 != '\0') {
              bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"a","b");
              local_68.success_ = !bVar3;
              local_68.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (!bVar3) {
                testing::AssertionResult::~AssertionResult(&local_68);
              }
              else {
                testing::Message::Message((Message *)&local_58);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_48,(internal *)&local_68,
                           (AssertionResult *)"!Overlaps(\"a\", \"b\")","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_50,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                           ,0x47,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                                  (char)local_48._M_dataplus._M_p));
                testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
                testing::internal::AssertHelper::~AssertHelper(&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
                    &local_48.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                           (char)local_48._M_dataplus._M_p));
                }
                if ((long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) + 8))();
                }
                testing::AssertionResult::~AssertionResult(&local_68);
                if (bVar3) {
                  return;
                }
              }
              bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"z1","z2");
              local_68.success_ = !bVar3;
              local_68.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (!bVar3) {
                testing::AssertionResult::~AssertionResult(&local_68);
              }
              else {
                testing::Message::Message((Message *)&local_58);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_48,(internal *)&local_68,
                           (AssertionResult *)"!Overlaps(\"z1\", \"z2\")","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_50,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                           ,0x48,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                                  (char)local_48._M_dataplus._M_p));
                testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
                testing::internal::AssertHelper::~AssertHelper(&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
                    &local_48.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                           (char)local_48._M_dataplus._M_p));
                }
                if ((long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) + 8))();
                }
                testing::AssertionResult::~AssertionResult(&local_68);
                if (bVar3) {
                  return;
                }
              }
              bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"a","p");
              local_68.success_ = bVar3;
              local_68.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (bVar3) {
                testing::AssertionResult::~AssertionResult(&local_68);
              }
              else {
                testing::Message::Message((Message *)&local_58);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_48,(internal *)&local_68,
                           (AssertionResult *)"Overlaps(\"a\", \"p\")","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_50,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                           ,0x49,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                                  (char)local_48._M_dataplus._M_p));
                testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
                testing::internal::AssertHelper::~AssertHelper(&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
                    &local_48.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                           (char)local_48._M_dataplus._M_p));
                }
                if ((long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) + 8))();
                }
                testing::AssertionResult::~AssertionResult(&local_68);
                if (!bVar3) {
                  return;
                }
              }
              bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"a","q");
              local_68.success_ = bVar3;
              local_68.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (bVar3) {
                testing::AssertionResult::~AssertionResult(&local_68);
              }
              else {
                testing::Message::Message((Message *)&local_58);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_48,(internal *)&local_68,
                           (AssertionResult *)"Overlaps(\"a\", \"q\")","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_50,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                           ,0x4a,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                                  (char)local_48._M_dataplus._M_p));
                testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
                testing::internal::AssertHelper::~AssertHelper(&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
                    &local_48.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                           (char)local_48._M_dataplus._M_p));
                }
                if ((long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) + 8))();
                }
                testing::AssertionResult::~AssertionResult(&local_68);
                if (!bVar3) {
                  return;
                }
              }
              bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"a","z");
              local_68.success_ = bVar3;
              local_68.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (bVar3) {
                testing::AssertionResult::~AssertionResult(&local_68);
              }
              else {
                testing::Message::Message((Message *)&local_58);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_48,(internal *)&local_68,(AssertionResult *)0x14a0c5,"false",
                           "true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_50,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                           ,0x4b,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                                  (char)local_48._M_dataplus._M_p));
                testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
                testing::internal::AssertHelper::~AssertHelper(&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
                    &local_48.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                           (char)local_48._M_dataplus._M_p));
                }
                if ((long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) + 8))();
                }
                testing::AssertionResult::~AssertionResult(&local_68);
                if (!bVar3) {
                  return;
                }
              }
              bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"p","p1");
              local_68.success_ = bVar3;
              local_68.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (bVar3) {
                testing::AssertionResult::~AssertionResult(&local_68);
              }
              else {
                testing::Message::Message((Message *)&local_58);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_48,(internal *)&local_68,
                           (AssertionResult *)"Overlaps(\"p\", \"p1\")","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_50,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                           ,0x4c,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                                  (char)local_48._M_dataplus._M_p));
                testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
                testing::internal::AssertHelper::~AssertHelper(&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
                    &local_48.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                           (char)local_48._M_dataplus._M_p));
                }
                if ((long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) + 8))();
                }
                testing::AssertionResult::~AssertionResult(&local_68);
                if (!bVar3) {
                  return;
                }
              }
              bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"p","q");
              local_68.success_ = bVar3;
              local_68.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (bVar3) {
                testing::AssertionResult::~AssertionResult(&local_68);
              }
              else {
                testing::Message::Message((Message *)&local_58);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_48,(internal *)&local_68,
                           (AssertionResult *)"Overlaps(\"p\", \"q\")","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_50,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                           ,0x4d,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                                  (char)local_48._M_dataplus._M_p));
                testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
                testing::internal::AssertHelper::~AssertHelper(&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
                    &local_48.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                           (char)local_48._M_dataplus._M_p));
                }
                if ((long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) + 8))();
                }
                testing::AssertionResult::~AssertionResult(&local_68);
                if (!bVar3) {
                  return;
                }
              }
              bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"p","z");
              local_68.success_ = bVar3;
              local_68.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (bVar3) {
                testing::AssertionResult::~AssertionResult(&local_68);
              }
              else {
                testing::Message::Message((Message *)&local_58);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_48,(internal *)&local_68,
                           (AssertionResult *)"Overlaps(\"p\", \"z\")","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_50,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                           ,0x4e,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                                  (char)local_48._M_dataplus._M_p));
                testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
                testing::internal::AssertHelper::~AssertHelper(&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
                    &local_48.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                           (char)local_48._M_dataplus._M_p));
                }
                if ((long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) + 8))();
                }
                testing::AssertionResult::~AssertionResult(&local_68);
                if (!bVar3) {
                  return;
                }
              }
              bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"p1","p2");
              local_68.success_ = bVar3;
              local_68.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (bVar3) {
                testing::AssertionResult::~AssertionResult(&local_68);
              }
              else {
                testing::Message::Message((Message *)&local_58);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_48,(internal *)&local_68,
                           (AssertionResult *)"Overlaps(\"p1\", \"p2\")","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_50,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                           ,0x4f,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                                  (char)local_48._M_dataplus._M_p));
                testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
                testing::internal::AssertHelper::~AssertHelper(&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
                    &local_48.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                           (char)local_48._M_dataplus._M_p));
                }
                if ((long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) + 8))();
                }
                testing::AssertionResult::~AssertionResult(&local_68);
                if (!bVar3) {
                  return;
                }
              }
              bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"p1","z");
              local_68.success_ = bVar3;
              local_68.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (bVar3) {
                testing::AssertionResult::~AssertionResult(&local_68);
              }
              else {
                testing::Message::Message((Message *)&local_58);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_48,(internal *)&local_68,
                           (AssertionResult *)"Overlaps(\"p1\", \"z\")","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_50,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                           ,0x50,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                                  (char)local_48._M_dataplus._M_p));
                testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
                testing::internal::AssertHelper::~AssertHelper(&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
                    &local_48.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                           (char)local_48._M_dataplus._M_p));
                }
                if ((long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) + 8))();
                }
                testing::AssertionResult::~AssertionResult(&local_68);
                if (!bVar3) {
                  return;
                }
              }
              bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"q","q");
              local_68.success_ = bVar3;
              local_68.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (bVar3) {
                testing::AssertionResult::~AssertionResult(&local_68);
              }
              else {
                testing::Message::Message((Message *)&local_58);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_48,(internal *)&local_68,
                           (AssertionResult *)"Overlaps(\"q\", \"q\")","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_50,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                           ,0x51,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                                  (char)local_48._M_dataplus._M_p));
                testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
                testing::internal::AssertHelper::~AssertHelper(&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
                    &local_48.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                           (char)local_48._M_dataplus._M_p));
                }
                if ((long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) + 8))();
                }
                testing::AssertionResult::~AssertionResult(&local_68);
                if (!bVar3) {
                  return;
                }
              }
              bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"q","q1");
              local_68.success_ = bVar3;
              local_68.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (bVar3) {
                testing::AssertionResult::~AssertionResult(&local_68);
              }
              else {
                testing::Message::Message((Message *)&local_58);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_48,(internal *)&local_68,
                           (AssertionResult *)"Overlaps(\"q\", \"q1\")","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_50,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                           ,0x52,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                                  (char)local_48._M_dataplus._M_p));
                testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
                testing::internal::AssertHelper::~AssertHelper(&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
                    &local_48.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                           (char)local_48._M_dataplus._M_p));
                }
                if ((long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) + 8))();
                }
                testing::AssertionResult::~AssertionResult(&local_68);
                if (!bVar3) {
                  return;
                }
              }
              bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,(char *)0x0,"j");
              local_68.success_ = !bVar3;
              local_68.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (!bVar3) {
                testing::AssertionResult::~AssertionResult(&local_68);
              }
              else {
                testing::Message::Message((Message *)&local_58);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_48,(internal *)&local_68,
                           (AssertionResult *)"!Overlaps(nullptr, \"j\")","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_50,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                           ,0x54,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                                  (char)local_48._M_dataplus._M_p));
                testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
                testing::internal::AssertHelper::~AssertHelper(&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
                    &local_48.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                           (char)local_48._M_dataplus._M_p));
                }
                if ((long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) + 8))();
                }
                testing::AssertionResult::~AssertionResult(&local_68);
                if (bVar3) {
                  return;
                }
              }
              bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"r",(char *)0x0);
              local_68.success_ = !bVar3;
              local_68.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (!bVar3) {
                testing::AssertionResult::~AssertionResult(&local_68);
              }
              else {
                testing::Message::Message((Message *)&local_58);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_48,(internal *)&local_68,
                           (AssertionResult *)"!Overlaps(\"r\", nullptr)","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_50,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                           ,0x55,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                                  (char)local_48._M_dataplus._M_p));
                testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
                testing::internal::AssertHelper::~AssertHelper(&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
                    &local_48.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                           (char)local_48._M_dataplus._M_p));
                }
                if ((long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) + 8))();
                }
                testing::AssertionResult::~AssertionResult(&local_68);
                if (bVar3) {
                  return;
                }
              }
              bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,(char *)0x0,"p");
              local_68.success_ = bVar3;
              local_68.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (bVar3) {
                testing::AssertionResult::~AssertionResult(&local_68);
              }
              else {
                testing::Message::Message((Message *)&local_58);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_48,(internal *)&local_68,
                           (AssertionResult *)"Overlaps(nullptr, \"p\")","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_50,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                           ,0x56,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                                  (char)local_48._M_dataplus._M_p));
                testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
                testing::internal::AssertHelper::~AssertHelper(&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
                    &local_48.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                           (char)local_48._M_dataplus._M_p));
                }
                if ((long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) + 8))();
                }
                testing::AssertionResult::~AssertionResult(&local_68);
                if (!bVar3) {
                  return;
                }
              }
              bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,(char *)0x0,"p1");
              local_68.success_ = bVar3;
              local_68.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (bVar3) {
                testing::AssertionResult::~AssertionResult(&local_68);
              }
              else {
                testing::Message::Message((Message *)&local_58);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_48,(internal *)&local_68,
                           (AssertionResult *)"Overlaps(nullptr, \"p1\")","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_50,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                           ,0x57,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                                  (char)local_48._M_dataplus._M_p));
                testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
                testing::internal::AssertHelper::~AssertHelper(&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
                    &local_48.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                           (char)local_48._M_dataplus._M_p));
                }
                if ((long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) + 8))();
                }
                testing::AssertionResult::~AssertionResult(&local_68);
                if (!bVar3) {
                  return;
                }
              }
              bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"q",(char *)0x0);
              local_68.success_ = bVar3;
              local_68.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (bVar3) {
                testing::AssertionResult::~AssertionResult(&local_68);
              }
              else {
                testing::Message::Message((Message *)&local_58);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_48,(internal *)&local_68,
                           (AssertionResult *)"Overlaps(\"q\", nullptr)","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_50,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                           ,0x58,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                                  (char)local_48._M_dataplus._M_p));
                testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
                testing::internal::AssertHelper::~AssertHelper(&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
                    &local_48.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                           (char)local_48._M_dataplus._M_p));
                }
                if ((long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) + 8))();
                }
                testing::AssertionResult::~AssertionResult(&local_68);
                if (!bVar3) {
                  return;
                }
              }
              bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,(char *)0x0,(char *)0x0);
              local_68.success_ = bVar3;
              local_68.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (!bVar3) {
                testing::Message::Message((Message *)&local_58);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_48,(internal *)&local_68,(AssertionResult *)0x14a114,"false",
                           "true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_50,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                           ,0x59,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                                  (char)local_48._M_dataplus._M_p));
                testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
                testing::internal::AssertHelper::~AssertHelper(&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
                    &local_48.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                           (char)local_48._M_dataplus._M_p));
                }
                if ((long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,(int)local_58.data_) + 8))();
                }
              }
              testing::AssertionResult::~AssertionResult(&local_68);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(FindFileTest, Single) {
  Add("p", "q");
  ASSERT_EQ(0, Find("a"));
  ASSERT_EQ(0, Find("p"));
  ASSERT_EQ(0, Find("p1"));
  ASSERT_EQ(0, Find("q"));
  ASSERT_EQ(1, Find("q1"));
  ASSERT_EQ(1, Find("z"));

  ASSERT_TRUE(!Overlaps("a", "b"));
  ASSERT_TRUE(!Overlaps("z1", "z2"));
  ASSERT_TRUE(Overlaps("a", "p"));
  ASSERT_TRUE(Overlaps("a", "q"));
  ASSERT_TRUE(Overlaps("a", "z"));
  ASSERT_TRUE(Overlaps("p", "p1"));
  ASSERT_TRUE(Overlaps("p", "q"));
  ASSERT_TRUE(Overlaps("p", "z"));
  ASSERT_TRUE(Overlaps("p1", "p2"));
  ASSERT_TRUE(Overlaps("p1", "z"));
  ASSERT_TRUE(Overlaps("q", "q"));
  ASSERT_TRUE(Overlaps("q", "q1"));

  ASSERT_TRUE(!Overlaps(nullptr, "j"));
  ASSERT_TRUE(!Overlaps("r", nullptr));
  ASSERT_TRUE(Overlaps(nullptr, "p"));
  ASSERT_TRUE(Overlaps(nullptr, "p1"));
  ASSERT_TRUE(Overlaps("q", nullptr));
  ASSERT_TRUE(Overlaps(nullptr, nullptr));
}